

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_leap_mpi.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  result_type rVar2;
  result_type rVar3;
  long in_all;
  double y;
  double x;
  long i;
  uniform01_dist<double> u;
  long in;
  yarn2 ry;
  yarn2 rx;
  int rank;
  int size;
  long samples;
  yarn2 *in_stack_ffffffffffffff78;
  parameter_type in_stack_ffffffffffffff80;
  long local_68;
  long local_58;
  undefined8 local_50;
  undefined8 local_38;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  undefined1 local_10 [8];
  undefined1 local_8 [4];
  undefined4 local_4;
  
  local_4 = 0;
  MPI_Init(local_8,local_10);
  MPI_Comm_size(&ompi_mpi_comm_world,&stack0xffffffffffffffe4);
  MPI_Comm_rank(&ompi_mpi_comm_world,&stack0xffffffffffffffe0);
  local_38 = trng::yarn2::LEcuyer1;
  trng::yarn2::yarn2(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  local_50 = trng::yarn2::LEcuyer1;
  trng::yarn2::yarn2(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  trng::yarn2::split((yarn2 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  trng::yarn2::split((yarn2 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  trng::yarn2::split((yarn2 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  trng::yarn2::split((yarn2 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  local_58 = 0;
  for (local_68 = (long)in_stack_ffffffffffffffe0; local_68 < 1000000;
      local_68 = in_stack_ffffffffffffffe4 + local_68) {
    rVar2 = trng::uniform01_dist<double>::operator()
                      ((uniform01_dist<double> *)in_stack_ffffffffffffff80.a,
                       in_stack_ffffffffffffff78);
    rVar3 = trng::uniform01_dist<double>::operator()
                      ((uniform01_dist<double> *)in_stack_ffffffffffffff80.a,
                       in_stack_ffffffffffffff78);
    if (rVar2 * rVar2 + rVar3 * rVar3 <= 1.0) {
      local_58 = local_58 + 1;
    }
  }
  MPI_Reduce(&local_58,&stack0xffffffffffffff80,1,&ompi_mpi_long,&ompi_mpi_op_sum,0,
             &ompi_mpi_comm_world);
  if (in_stack_ffffffffffffffe0 == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"pi = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,((double)(long)in_stack_ffffffffffffff80.a * 4.0) / 1000000.0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  const long samples{1000000l};  // total number of points in square
  MPI_Init(&argc, &argv);        // initialize MPI environment
  int size, rank;
  MPI_Comm_size(MPI_COMM_WORLD, &size);  // get total number of processes
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);  // get rank of current process
  trng::yarn2 rx, ry;                    // random number engines for x- and y-coordinates
  // split PRN sequences by leapfrog method
  rx.split(2, 0);            // choose sub-stream no. 0 out of 2 streams
  ry.split(2, 1);            // choose sub-stream no. 1 out of 2 streams
  rx.split(size, rank);      // choose sub-stream no. rank out of size streams
  ry.split(size, rank);      // choose sub-stream no. rank out of size streams
  long in{0l};               // number of points in circle
  trng::uniform01_dist<> u;  // random number distribution
  // throw random points into square and distribute workload over all processes
  for (long i{rank}; i < samples; i += size) {
    const double x{u(rx)}, y{u(ry)};  // choose random x- and y-coordinates
    if (x * x + y * y <= 1.0)         // is point in circle?
      ++in;                           // increase counter
  }
  // calculate sum of all local variables 'in' and storre result in 'in_all' on process 0
  long in_all;
  MPI_Reduce(&in, &in_all, 1, MPI_LONG, MPI_SUM, 0, MPI_COMM_WORLD);
  if (rank == 0)  // print result
    std::cout << "pi = " << 4.0 * in_all / samples << std::endl;
  MPI_Finalize();  // quit MPI
  return EXIT_SUCCESS;
}